

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

char * find_module_env_file(char *apprun_path)

{
  int iVar1;
  size_t sVar2;
  char *dest;
  
  sVar2 = strlen(apprun_path);
  dest = (char *)calloc(1,sVar2 + 5);
  apprun_concat_path(dest,apprun_path);
  sVar2 = strlen(dest);
  builtin_strncpy(dest + sVar2,".env",5);
  iVar1 = access(dest,0);
  if (iVar1 != 0) {
    free(dest);
    dest = (char *)0x0;
  }
  return dest;
}

Assistant:

char *find_module_env_file(char *apprun_path) {
    const char apprun_env_extension[] = ".env";
    const unsigned long apprun_env_extension_len = strlen(apprun_env_extension);

    const unsigned long possible_path_len = strlen(apprun_path) + apprun_env_extension_len + 1;
    char *possible_path = malloc(possible_path_len);
    memset(possible_path, 0, possible_path_len);

    apprun_concat_path(possible_path, apprun_path);
    strncat(possible_path, apprun_env_extension, apprun_env_extension_len);

#ifdef DEBUG
    fprintf(stderr, "APPRUN_DEBUG: Looking for %s file at: %s\n", apprun_env_extension, possible_path);
#endif
    if (access(possible_path, F_OK) == 0)
        return possible_path;
    else
        free(possible_path);


    return NULL;
}